

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deArrayBuffer.hpp
# Opt level: O1

ArrayBuffer<int,_4UL,_4UL> * __thiscall
de::ArrayBuffer<int,_4UL,_4UL>::operator=
          (ArrayBuffer<int,_4UL,_4UL> *this,ArrayBuffer<int,_4UL,_4UL> *other)

{
  void *ptr;
  size_t sVar1;
  ArrayBuffer<int,_4UL,_4UL> copied;
  ArrayBuffer<int,_4UL,_4UL> local_28;
  
  ArrayBuffer(&local_28,other);
  ptr = this->m_ptr;
  sVar1 = this->m_cap;
  this->m_ptr = local_28.m_ptr;
  this->m_cap = local_28.m_cap;
  local_28.m_ptr = ptr;
  local_28.m_cap = sVar1;
  deAlignedFree(ptr);
  return this;
}

Assistant:

ArrayBuffer<T,Alignment,Stride>& ArrayBuffer<T,Alignment,Stride>::operator= (const ArrayBuffer& other)
{
	ArrayBuffer copied(other);
	swap(copied);
	return *this;
}